

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathway.c
# Opt level: O2

void read_pathway(pathway_t *record,int field_count,char **field_names,char **field_values)

{
  double dVar1;
  int iVar2;
  pathway_mode_t pVar3;
  pathway_directions_t pVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  pathway_t *__dest;
  ulong uVar8;
  
  uVar6 = 0;
  record->id[0] = '\0';
  record->from_stop_id[0] = '\0';
  record->to_stop_id[0] = '\0';
  record->mode = PTMD_NOT_SET;
  record->is_bidirectional = PD_NOT_SET;
  record->reversed_signposted_as[0] = '\0';
  record->length = 0.0;
  record->traversal_time = 0;
  record->stair_count = 0;
  record->max_slope = 0.0;
  record->min_width = 0.0;
  record->signposted_as[0] = '\0';
  uVar8 = (ulong)(uint)field_count;
  if (field_count < 1) {
    uVar8 = uVar6;
  }
  do {
    if (uVar8 == uVar6) {
      return;
    }
    pcVar7 = field_names[uVar6];
    iVar2 = strcmp(pcVar7,"pathway_id");
    if (iVar2 == 0) {
      pcVar7 = field_values[uVar6];
      __dest = record;
LAB_00105745:
      strcpy(__dest->id,pcVar7);
    }
    else {
      iVar2 = strcmp(pcVar7,"from_stop_id");
      if (iVar2 == 0) {
        pcVar7 = field_values[uVar6];
        __dest = (pathway_t *)record->from_stop_id;
        goto LAB_00105745;
      }
      iVar2 = strcmp(pcVar7,"to_stop_id");
      if (iVar2 == 0) {
        pcVar7 = field_values[uVar6];
        __dest = (pathway_t *)record->to_stop_id;
        goto LAB_00105745;
      }
      iVar2 = strcmp(pcVar7,"pathway_mode");
      if (iVar2 == 0) {
        pVar3 = parse_pathway_mode(field_values[uVar6]);
        record->mode = pVar3;
      }
      else {
        iVar2 = strcmp(pcVar7,"is_bidirectional");
        if (iVar2 == 0) {
          pVar4 = parse_pathway_directions(field_values[uVar6]);
          record->is_bidirectional = pVar4;
        }
        else {
          iVar2 = strcmp(pcVar7,"length");
          if (iVar2 == 0) {
            dVar1 = strtod(field_values[uVar6],(char **)0x0);
            record->length = dVar1;
          }
          else {
            iVar2 = strcmp(pcVar7,"traversal_time");
            if (iVar2 == 0) {
              lVar5 = strtol(field_values[uVar6],(char **)0x0,0);
              record->traversal_time = (int)lVar5;
            }
            else {
              iVar2 = strcmp(pcVar7,"stair_count");
              if (iVar2 == 0) {
                lVar5 = strtol(field_values[uVar6],(char **)0x0,0);
                record->stair_count = (int)lVar5;
              }
              else {
                iVar2 = strcmp(pcVar7,"max_slope");
                if (iVar2 == 0) {
                  dVar1 = strtod(field_values[uVar6],(char **)0x0);
                  record->max_slope = dVar1;
                }
                else {
                  iVar2 = strcmp(pcVar7,"min_width");
                  if (iVar2 != 0) {
                    iVar2 = strcmp(pcVar7,"signposted_as");
                    if (iVar2 == 0) {
                      pcVar7 = field_values[uVar6];
                      __dest = (pathway_t *)record->signposted_as;
                    }
                    else {
                      iVar2 = strcmp(pcVar7,"reversed_signposted_as");
                      if (iVar2 != 0) goto LAB_0010574a;
                      pcVar7 = field_values[uVar6];
                      __dest = (pathway_t *)record->reversed_signposted_as;
                    }
                    goto LAB_00105745;
                  }
                  dVar1 = strtod(field_values[uVar6],(char **)0x0);
                  record->min_width = dVar1;
                }
              }
            }
          }
        }
      }
    }
LAB_0010574a:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void read_pathway(pathway_t *record, int field_count, const char **field_names, const char **field_values) {
    init_pathway(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "pathway_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "from_stop_id") == 0) {
            strcpy(record->from_stop_id, field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "to_stop_id") == 0) {
            strcpy(record->to_stop_id, field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "pathway_mode") == 0) {
            record->mode = parse_pathway_mode(field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "is_bidirectional") == 0) {
            record->is_bidirectional = parse_pathway_directions(field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "length") == 0) {
            record->length = strtod(field_values[i], NULL);
            continue;
        }

        if (strcmp(field_names[i], "traversal_time") == 0) {
            record->traversal_time = (int)strtol(field_values[i], NULL, 0);
            continue;
        }

        if (strcmp(field_names[i], "stair_count") == 0) {
            record->stair_count = (int)strtol(field_values[i], NULL, 0);
            continue;
        }

        if (strcmp(field_names[i], "max_slope") == 0) {
            record->max_slope = strtod(field_values[i], NULL);
            continue;
        }

        if (strcmp(field_names[i], "min_width") == 0) {
            record->min_width = strtod(field_values[i], NULL);
            continue;
        }

        if (strcmp(field_names[i], "signposted_as") == 0) {
            strcpy(record->signposted_as, field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "reversed_signposted_as") == 0) {
            strcpy(record->reversed_signposted_as, field_values[i]);
            continue;
        }
    }
}